

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::anon_unknown_1::AllFeaturesGroup::init
          (AllFeaturesGroup *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  undefined8 extraout_RAX;
  undefined8 uVar1;
  RandomShaderCase *pRVar2;
  undefined8 extraout_RAX_00;
  int seed;
  deUint32 seed_00;
  ProgramParameters PStack_98;
  
  rsg::ProgramParameters::ProgramParameters(&PStack_98);
  PStack_98.useScalarConversions = true;
  PStack_98.useSwizzle = true;
  PStack_98.useComparisonOps = true;
  PStack_98.useConditionals = true;
  PStack_98.trigonometricBaseWeight = 1.0;
  PStack_98.exponentialBaseWeight = 1.0;
  PStack_98.vertexParameters.maxStatementDepth = 4;
  PStack_98.vertexParameters.maxStatementsPerBlock = 7;
  PStack_98.vertexParameters.maxExpressionDepth = 7;
  PStack_98.vertexParameters.maxCombinedVariableScalars = 0x40;
  PStack_98.fragmentParameters.maxStatementDepth = 4;
  PStack_98.fragmentParameters.maxStatementsPerBlock = 7;
  PStack_98.fragmentParameters.maxExpressionDepth = 7;
  PStack_98.fragmentParameters.maxCombinedVariableScalars = 0x40;
  PStack_98.fragmentParameters.texLookupBaseWeight = 4.0;
  PStack_98.fragmentParameters.useTexture2D = true;
  PStack_98.fragmentParameters.useTextureCube = true;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  uVar1 = extraout_RAX;
  for (seed_00 = 0; seed_00 != 100; seed_00 = seed_00 + 1) {
    pRVar2 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Texture lookups in vertex shader",
                        &PStack_98,seed_00,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar2);
    pRVar2 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Texture lookups in fragment shader",
                        &PStack_98,seed_00,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar2);
    uVar1 = extraout_RAX_00;
  }
  return (int)uVar1;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;
		params.useScalarConversions		= true;
		params.useSwizzle				= true;
		params.useComparisonOps			= true;
		params.useConditionals			= true;
		params.trigonometricBaseWeight	= 1.0f;
		params.exponentialBaseWeight	= 1.0f;

		params.vertexParameters.maxStatementDepth				= 4;
		params.vertexParameters.maxStatementsPerBlock			= 7;
		params.vertexParameters.maxExpressionDepth				= 7;
		params.vertexParameters.maxCombinedVariableScalars		= 64;
		params.fragmentParameters.maxStatementDepth				= 4;
		params.fragmentParameters.maxStatementsPerBlock			= 7;
		params.fragmentParameters.maxExpressionDepth			= 7;
		params.fragmentParameters.maxCombinedVariableScalars	= 64;

		params.fragmentParameters.texLookupBaseWeight		= 4.0f; // \note Texture lookups are enabled for fragment shaders only.
		params.fragmentParameters.useTexture2D				= true;
		params.fragmentParameters.useTextureCube			= true;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		for (int seed = 0; seed < 100; seed++)
		{
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Texture lookups in vertex shader",		params, seed, true, false));
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Texture lookups in fragment shader",	params, seed, false, true));
		}
	}